

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall MyXmlParser::onStartElement(MyXmlParser *this,char *name,char **attributes)

{
  char **ppcVar1;
  size_t *psVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (this->m_indent != 0) {
    uVar4 = 0;
    do {
      printf("  ");
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->m_indent);
  }
  printf("<%s",name);
  if (*attributes != (char *)0x0) {
    putchar(10);
    this->m_indent = this->m_indent + 1;
    pcVar3 = *attributes;
    while (pcVar3 != (char *)0x0) {
      if (this->m_indent != 0) {
        uVar4 = 0;
        do {
          printf("  ");
          uVar4 = uVar4 + 1;
        } while (uVar4 < this->m_indent);
      }
      printf("%s = %s\n",*attributes,attributes[1]);
      ppcVar1 = attributes + 2;
      attributes = attributes + 2;
      pcVar3 = *ppcVar1;
    }
    psVar2 = &this->m_indent;
    *psVar2 = *psVar2 - 1;
    if (*psVar2 != 0) {
      uVar4 = 0;
      do {
        printf("  ");
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->m_indent);
    }
  }
  puts(">");
  this->m_indent = this->m_indent + 1;
  return;
}

Assistant:

void
	onStartElement(
		const char* name,
		const char** attributes
	) {
		printIndent();
		printf("<%s", name);

		if (*attributes) {
			printf("\n");
			m_indent++;

			while (*attributes) {
				printIndent();
				printf("%s = %s\n", attributes [0], attributes [1]);
				attributes += 2;
			}

			m_indent--;
			printIndent();
		}

		printf(">\n");
		m_indent++;
	}